

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotScatterEx<ImPlot::GetterYs<double>>(char *label_id,GetterYs<double> *getter)

{
  bool bVar1;
  TransformerLogLog transformer;
  int iVar2;
  double *pdVar3;
  ImPlotPlot *pIVar4;
  ImPlotContext *pIVar5;
  bool bVar6;
  ImU32 col_mk_line;
  ImU32 col_mk_fill;
  int iVar7;
  int iVar8;
  float fVar9;
  float fVar10;
  double dVar11;
  double dVar12;
  float fVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  double *pdVar16;
  ImPlotPoint p;
  ImPlotPoint local_90;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  double local_68;
  double local_60;
  double *local_58;
  double local_50;
  double local_48;
  ImDrawList *local_40;
  ImPlotContext *local_38;
  
  bVar6 = BeginItem(label_id,2);
  if (bVar6) {
    if ((GImPlot->FitThisFrame == true) && (iVar7 = getter->Count, 0 < iVar7)) {
      iVar8 = 0;
      do {
        local_90.x = (double)iVar8 * getter->XScale + getter->X0;
        local_90.y = *(double *)
                      ((long)getter->Ys +
                      (long)(((getter->Offset + iVar8) % iVar7 + iVar7) % iVar7) *
                      (long)getter->Stride);
        FitPoint(&local_90);
        iVar8 = iVar8 + 1;
        iVar7 = getter->Count;
      } while (iVar8 < iVar7);
    }
    pIVar5 = GImPlot;
    local_40 = GetPlotDrawList();
    iVar7 = (pIVar5->NextItemData).Marker;
    iVar8 = 0;
    if (iVar7 != -1) {
      iVar8 = iVar7;
    }
    col_mk_line = ImGui::GetColorU32((pIVar5->NextItemData).Colors + 2);
    col_mk_fill = ImGui::GetColorU32((pIVar5->NextItemData).Colors + 3);
    transformer.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
    local_38 = GImPlot;
    switch(GImPlot->Scales[transformer.YAxis]) {
    case 0:
      iVar7 = getter->Count;
      if (0 < iVar7) {
        pdVar3 = getter->Ys;
        local_50 = getter->XScale;
        uVar14 = SUB84(local_50,0);
        uVar15 = (undefined4)((ulong)local_50 >> 0x20);
        pdVar16 = (double *)getter->X0;
        dVar11 = (double)(ulong)(uint)getter->Offset;
        local_68 = (double)CONCAT44(local_68._4_4_,(pIVar5->NextItemData).MarkerSize);
        local_70 = CONCAT44(local_70._4_4_,(pIVar5->NextItemData).MarkerWeight);
        iVar2 = getter->Stride;
        local_78 = (ulong)iVar8;
        iVar8 = 0;
        dVar12 = 0.0;
        bVar6 = (pIVar5->NextItemData).RenderMarkerLine;
        local_80 = CONCAT44(local_80._4_4_,(uint)(pIVar5->NextItemData).RenderMarkerFill);
        local_60 = dVar11;
        local_58 = pdVar16;
        do {
          fVar9 = (float)((((double)CONCAT44(uVar15,uVar14) * dVar12 + (double)pdVar16) -
                          (GImPlot->CurrentPlot->XAxis).Range.Min) * GImPlot->Mx +
                         (double)GImPlot->PixelRange[transformer.YAxis].Min.x);
          fVar10 = (float)((*(double *)
                             ((long)pdVar3 +
                             (long)(((SUB84(dVar11,0) + iVar8) % iVar7 + iVar7) % iVar7) *
                             (long)iVar2) - GImPlot->CurrentPlot->YAxis[transformer.YAxis].Range.Min
                           ) * GImPlot->My[transformer.YAxis] +
                          (double)GImPlot->PixelRange[transformer.YAxis].Min.y);
          local_90.x = (double)CONCAT44(fVar10,fVar9);
          pIVar4 = local_38->CurrentPlot;
          if ((((pIVar4->PlotRect).Min.x <= fVar9) && ((pIVar4->PlotRect).Min.y <= fVar10)) &&
             ((fVar9 < (pIVar4->PlotRect).Max.x && (fVar10 < (pIVar4->PlotRect).Max.y)))) {
            local_48 = dVar12;
            (**(code **)(RenderMarkers<ImPlot::TransformerLinLin,ImPlot::GetterYs<double>>(ImPlot::GetterYs<double>,ImPlot::TransformerLinLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + local_78 * 8))
                      ((ulong)local_68 & 0xffffffff,local_70 & 0xffffffff,local_40,&local_90,bVar6,
                       col_mk_line,local_80 & 0xffffffff,col_mk_fill);
            uVar14 = SUB84(local_50,0);
            uVar15 = (undefined4)((ulong)local_50 >> 0x20);
            dVar11 = local_60;
            pdVar16 = local_58;
            dVar12 = local_48;
          }
          dVar12 = dVar12 + 1.0;
          iVar8 = iVar8 + 1;
        } while (iVar7 != iVar8);
      }
      break;
    case 1:
      iVar7 = getter->Count;
      if (0 < iVar7) {
        local_58 = getter->Ys;
        local_60 = getter->XScale;
        local_68 = getter->X0;
        local_70 = (ulong)(uint)getter->Offset;
        local_78 = CONCAT44(local_78._4_4_,(pIVar5->NextItemData).MarkerSize);
        fVar9 = (pIVar5->NextItemData).MarkerWeight;
        iVar2 = getter->Stride;
        local_80 = (ulong)iVar8;
        iVar8 = 0;
        dVar11 = 0.0;
        bVar6 = (pIVar5->NextItemData).RenderMarkerLine;
        bVar1 = (pIVar5->NextItemData).RenderMarkerFill;
        do {
          pIVar5 = GImPlot;
          local_50 = *(double *)
                      ((long)local_58 +
                      (long)((((int)local_70 + iVar8) % iVar7 + iVar7) % iVar7) * (long)iVar2);
          local_48 = dVar11;
          dVar12 = log10((local_60 * dVar11 + local_68) / (GImPlot->CurrentPlot->XAxis).Range.Min);
          pIVar4 = pIVar5->CurrentPlot;
          dVar11 = (pIVar4->XAxis).Range.Min;
          fVar10 = (float)((((double)(float)(dVar12 / pIVar5->LogDenX) *
                             ((pIVar4->XAxis).Range.Max - dVar11) + dVar11) - dVar11) * pIVar5->Mx +
                          (double)pIVar5->PixelRange[transformer.YAxis].Min.x);
          fVar13 = (float)((local_50 - pIVar4->YAxis[transformer.YAxis].Range.Min) *
                           pIVar5->My[transformer.YAxis] +
                          (double)pIVar5->PixelRange[transformer.YAxis].Min.y);
          local_90.x = (double)CONCAT44(fVar13,fVar10);
          pIVar4 = local_38->CurrentPlot;
          if ((((pIVar4->PlotRect).Min.x <= fVar10) && ((pIVar4->PlotRect).Min.y <= fVar13)) &&
             ((fVar10 < (pIVar4->PlotRect).Max.x && (fVar13 < (pIVar4->PlotRect).Max.y)))) {
            (**(code **)(RenderMarkers<ImPlot::TransformerLogLin,ImPlot::GetterYs<double>>(ImPlot::GetterYs<double>,ImPlot::TransformerLogLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + local_80 * 8))
                      (local_78 & 0xffffffff,fVar9,local_40,&local_90,bVar6,col_mk_line,bVar1,
                       col_mk_fill);
          }
          dVar11 = local_48 + 1.0;
          iVar8 = iVar8 + 1;
        } while (iVar7 != iVar8);
      }
      break;
    case 2:
      iVar7 = getter->Count;
      if (0 < iVar7) {
        local_58 = getter->Ys;
        local_60 = getter->XScale;
        local_68 = getter->X0;
        local_70 = (ulong)(uint)getter->Offset;
        local_78 = CONCAT44(local_78._4_4_,(pIVar5->NextItemData).MarkerSize);
        fVar9 = (pIVar5->NextItemData).MarkerWeight;
        iVar2 = getter->Stride;
        local_80 = (ulong)iVar8;
        iVar8 = 0;
        dVar11 = 0.0;
        bVar6 = (pIVar5->NextItemData).RenderMarkerLine;
        bVar1 = (pIVar5->NextItemData).RenderMarkerFill;
        do {
          pIVar5 = GImPlot;
          local_50 = local_60 * dVar11 + local_68;
          local_48 = dVar11;
          dVar12 = log10(*(double *)
                          ((long)local_58 +
                          (long)((((int)local_70 + iVar8) % iVar7 + iVar7) % iVar7) * (long)iVar2) /
                         GImPlot->CurrentPlot->YAxis[transformer.YAxis].Range.Min);
          pIVar4 = pIVar5->CurrentPlot;
          dVar11 = pIVar4->YAxis[transformer.YAxis].Range.Min;
          fVar13 = (float)((local_50 - (pIVar4->XAxis).Range.Min) * pIVar5->Mx +
                          (double)pIVar5->PixelRange[transformer.YAxis].Min.x);
          fVar10 = (float)((((double)(float)(dVar12 / pIVar5->LogDenY[transformer.YAxis]) *
                             (pIVar4->YAxis[transformer.YAxis].Range.Max - dVar11) + dVar11) -
                           dVar11) * pIVar5->My[transformer.YAxis] +
                          (double)pIVar5->PixelRange[transformer.YAxis].Min.y);
          local_90.x = (double)CONCAT44(fVar10,fVar13);
          pIVar4 = local_38->CurrentPlot;
          if (((((pIVar4->PlotRect).Min.x <= fVar13) && ((pIVar4->PlotRect).Min.y <= fVar10)) &&
              (fVar13 < (pIVar4->PlotRect).Max.x)) && (fVar10 < (pIVar4->PlotRect).Max.y)) {
            (**(code **)(RenderMarkers<ImPlot::TransformerLinLog,ImPlot::GetterYs<double>>(ImPlot::GetterYs<double>,ImPlot::TransformerLinLog,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + local_80 * 8))
                      (local_78 & 0xffffffff,fVar9,local_40,&local_90,bVar6,col_mk_line,bVar1,
                       col_mk_fill);
          }
          dVar11 = local_48 + 1.0;
          iVar8 = iVar8 + 1;
        } while (iVar7 != iVar8);
      }
      break;
    case 3:
      RenderMarkers<ImPlot::TransformerLogLog,ImPlot::GetterYs<double>>
                (*getter,transformer,local_40,iVar8,(pIVar5->NextItemData).MarkerSize,
                 (pIVar5->NextItemData).RenderMarkerLine,col_mk_line,
                 (pIVar5->NextItemData).MarkerWeight,(pIVar5->NextItemData).RenderMarkerFill,
                 col_mk_fill);
    }
    pIVar5 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar5->NextItemData);
    pIVar5->PreviousItem = pIVar5->CurrentItem;
    pIVar5->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

inline void PlotScatterEx(const char* label_id, const Getter& getter) {
    if (BeginItem(label_id, ImPlotCol_MarkerOutline)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(p);
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        // render markers
        ImPlotMarker marker = s.Marker == ImPlotMarker_None ? ImPlotMarker_Circle : s.Marker;
        if (marker != ImPlotMarker_None) {
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerOutline]);
            const ImU32 col_fill = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerFill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderMarkers(getter, TransformerLinLin(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLin: RenderMarkers(getter, TransformerLogLin(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LinLog: RenderMarkers(getter, TransformerLinLog(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLog: RenderMarkers(getter, TransformerLogLog(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
            }
        }
        EndItem();
    }
}